

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_aggregator.cpp
# Opt level: O1

void __thiscall
duckdb::WindowAggregatorLocalState::Finalize
          (WindowAggregatorLocalState *this,WindowAggregatorGlobalState *gastate,
          CollectionPtr collection)

{
  WindowAggregator *pWVar1;
  _Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_> __ptr_00;
  optional_ptr<duckdb::WindowCollection,_true> paged;
  _Head_base<0UL,_duckdb::WindowCursor_*,_false> _Var2;
  unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *this_00;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::WindowCursor_*,_false> local_48;
  optional_ptr<duckdb::WindowCollection,_true> local_40;
  vector<unsigned_long,_true> local_38;
  
  if ((this->cursor).
      super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
      super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
      super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl == (WindowCursor *)0x0) {
    local_40.ptr = collection.ptr;
    optional_ptr<duckdb::WindowCollection,_true>::CheckValid(&local_40);
    paged.ptr = local_40.ptr;
    pWVar1 = gastate->aggregator;
    _Var2._M_head_impl = (WindowCursor *)operator_new(200);
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_38,
               &(pWVar1->child_idx).super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
    WindowCursor::WindowCursor(_Var2._M_head_impl,paged.ptr,&local_38);
    this_00 = &this->cursor;
    local_48._M_head_impl = _Var2._M_head_impl;
    if (local_38.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    _Var2._M_head_impl = local_48._M_head_impl;
    local_48._M_head_impl = (WindowCursor *)0x0;
    __ptr_00.super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl =
         (this_00->
         super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>)._M_t.
         super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
         super__Head_base<0UL,_duckdb::WindowCursor_*,_false>;
    (this_00->super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>).
    _M_t.super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>.
    _M_t.super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>.
    super__Head_base<0UL,_duckdb::WindowCursor_*,_false> =
         (_Head_base<0UL,_duckdb::WindowCursor_*,_false>)_Var2._M_head_impl;
    if (__ptr_00.super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl !=
        (WindowCursor *)0x0) {
      ::std::default_delete<duckdb::WindowCursor>::operator()
                ((default_delete<duckdb::WindowCursor> *)this_00,
                 (WindowCursor *)
                 __ptr_00.super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl);
    }
    if (local_48._M_head_impl != (WindowCursor *)0x0) {
      ::std::default_delete<duckdb::WindowCursor>::operator()
                ((default_delete<duckdb::WindowCursor> *)&local_48,local_48._M_head_impl);
    }
  }
  return;
}

Assistant:

void WindowAggregatorLocalState::Finalize(WindowAggregatorGlobalState &gastate, CollectionPtr collection) {
	// Prepare to scan
	if (!cursor) {
		cursor = make_uniq<WindowCursor>(*collection, gastate.aggregator.child_idx);
	}
}